

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

void __thiscall google::protobuf::OneofDescriptorProto::Clear(OneofDescriptorProto *this)

{
  ulong uVar1;
  OneofOptions *this_00;
  anon_union_24_1_493b367e_for_OneofDescriptorProto_3 aVar2;
  undefined8 *puVar3;
  char *failure_msg;
  int line;
  char *file;
  LogMessageFatal LStack_18;
  
  aVar2 = this->field_0;
  if (((undefined1  [24])aVar2 & (undefined1  [24])0x3) != (undefined1  [24])0x0) {
    if (((undefined1  [24])aVar2 & (undefined1  [24])0x1) != (undefined1  [24])0x0) {
      uVar1 = *(ulong *)((long)&this->field_0 + 8);
      if ((uVar1 & 3) == 0) {
        file = 
        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arenastring.h"
        ;
        failure_msg = "!tagged_ptr_.IsDefault()";
        line = 0x20b;
        goto LAB_003db01e;
      }
      puVar3 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
      puVar3[1] = 0;
      *(undefined1 *)*puVar3 = 0;
    }
    if (((undefined1  [24])aVar2 & (undefined1  [24])0x2) != (undefined1  [24])0x0) {
      this_00 = (this->field_0)._impl_.options_;
      if (this_00 == (OneofOptions *)0x0) {
        file = 
        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.cc"
        ;
        failure_msg = "_impl_.options_ != nullptr";
        line = 0x1779;
LAB_003db01e:
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  (&LStack_18,file,line,failure_msg);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&LStack_18);
      }
      OneofOptions::Clear(this_00);
    }
  }
  (this->field_0)._impl_._has_bits_.has_bits_[0] = 0;
  if (((this->super_Message).super_MessageLite._internal_metadata_.ptr_ & 1) == 0) {
    return;
  }
  internal::InternalMetadata::DoClear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void OneofDescriptorProto::Clear() {
// @@protoc_insertion_point(message_clear_start:google.protobuf.OneofDescriptorProto)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  cached_has_bits = _impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000003u) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _impl_.name_.ClearNonDefaultToEmpty();
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      ABSL_DCHECK(_impl_.options_ != nullptr);
      _impl_.options_->Clear();
    }
  }
  _impl_._has_bits_.Clear();
  _internal_metadata_.Clear<::google::protobuf::UnknownFieldSet>();
}